

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  ImRect IVar10;
  
  fVar1 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    fVar9 = (window->Pos).y;
    fVar3 = (window->InnerRect).Max.x;
    fVar8 = (window->InnerRect).Min.x;
    fVar2 = fVar9 + (window->Size).y;
    fVar1 = (fVar2 - window->WindowBorderSize) - fVar1;
    uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar9),2);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar9 = (float)((uint)bVar7 * (int)fVar9 + (uint)!bVar7 * (int)fVar1);
  }
  else {
    fVar8 = (window->Pos).x;
    fVar2 = (window->InnerRect).Max.y;
    fVar9 = (window->InnerRect).Min.y;
    fVar3 = fVar8 + (window->Size).x;
    fVar1 = (fVar3 - window->WindowBorderSize) - fVar1;
    uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar8),2);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar8 = (float)((uint)bVar7 * (int)fVar8 + (uint)!bVar7 * (int)fVar1);
  }
  auVar4 = vinsertps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2),0x10);
  auVar5 = vinsertps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar9),0x10);
  IVar10.Min = auVar5._0_8_;
  IVar10.Max = auVar4._0_8_;
  return IVar10;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}